

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O3

Value * __thiscall
cmake::ReportCapabilitiesJson(Value *__return_storage_ptr__,cmake *this,bool haveServerMode)

{
  string *psVar1;
  Value *pVVar2;
  mapped_type *pmVar3;
  string *value;
  __node_base _Var4;
  vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_> generatorInfoList;
  Value version;
  Value generators;
  JsonValueMapType generatorMap;
  vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_> local_308;
  Value local_2e8;
  Value local_2c0;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Json::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Json::Value>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_298;
  Value local_260;
  Value local_238;
  Value local_210;
  Value local_1e8;
  Value local_1c0;
  Value local_198;
  Value local_170;
  Value local_148;
  Value local_120;
  Value local_f8;
  Value local_d0;
  Value local_a8;
  Value local_80;
  Value local_58;
  
  Json::Value::Value(__return_storage_ptr__,objectValue);
  Json::Value::Value(&local_2e8,objectValue);
  Json::Value::Value(&local_120,"3.9.20170807-gcd520");
  pVVar2 = Json::Value::operator[](&local_2e8,"string");
  Json::Value::operator=(pVVar2,&local_120);
  Json::Value::~Value(&local_120);
  Json::Value::Value(&local_148,3);
  pVVar2 = Json::Value::operator[](&local_2e8,"major");
  Json::Value::operator=(pVVar2,&local_148);
  Json::Value::~Value(&local_148);
  Json::Value::Value(&local_170,9);
  pVVar2 = Json::Value::operator[](&local_2e8,"minor");
  Json::Value::operator=(pVVar2,&local_170);
  Json::Value::~Value(&local_170);
  Json::Value::Value(&local_198,"gcd520");
  pVVar2 = Json::Value::operator[](&local_2e8,"suffix");
  Json::Value::operator=(pVVar2,&local_198);
  Json::Value::~Value(&local_198);
  Json::Value::Value(&local_1c0,false);
  pVVar2 = Json::Value::operator[](&local_2e8,"isDirty");
  Json::Value::operator=(pVVar2,&local_1c0);
  Json::Value::~Value(&local_1c0);
  Json::Value::Value(&local_1e8,0x133c837);
  pVVar2 = Json::Value::operator[](&local_2e8,"patch");
  Json::Value::operator=(pVVar2,&local_1e8);
  Json::Value::~Value(&local_1e8);
  Json::Value::Value(&local_210,&local_2e8);
  pVVar2 = Json::Value::operator[](__return_storage_ptr__,"version");
  Json::Value::operator=(pVVar2,&local_210);
  Json::Value::~Value(&local_210);
  local_308.super__Vector_base<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_308.super__Vector_base<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_308.super__Vector_base<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  GetRegisteredGenerators(this,&local_308);
  local_298._M_buckets = &local_298._M_single_bucket;
  local_298._M_bucket_count = 1;
  local_298._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_298._M_element_count = 0;
  local_298._M_rehash_policy._M_max_load_factor = 1.0;
  local_298._M_rehash_policy._M_next_resize = 0;
  local_298._M_single_bucket = (__node_base_ptr)0x0;
  if (local_308.super__Vector_base<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_308.super__Vector_base<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    value = &(local_308.
              super__Vector_base<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>.
              _M_impl.super__Vector_impl_data._M_start)->extraName;
    do {
      if (*(char *)((long)&value[1]._M_dataplus._M_p + 2) == '\0') {
        if (value->_M_string_length == 0) {
          Json::Value::Value(&local_2c0,objectValue);
          Json::Value::Value(&local_a8,value + -2);
          pVVar2 = Json::Value::operator[](&local_2c0,"name");
          Json::Value::operator=(pVVar2,&local_a8);
          Json::Value::~Value(&local_a8);
          Json::Value::Value(&local_d0,*(bool *)&value[1]._M_dataplus._M_p);
          pVVar2 = Json::Value::operator[](&local_2c0,"toolsetSupport");
          Json::Value::operator=(pVVar2,&local_d0);
          Json::Value::~Value(&local_d0);
          Json::Value::Value(&local_f8,*(bool *)((long)&value[1]._M_dataplus._M_p + 1));
          pVVar2 = Json::Value::operator[](&local_2c0,"platformSupport");
          Json::Value::operator=(pVVar2,&local_f8);
          Json::Value::~Value(&local_f8);
          Json::Value::Value(&local_58,arrayValue);
          pVVar2 = Json::Value::operator[](&local_2c0,"extraGenerators");
          Json::Value::operator=(pVVar2,&local_58);
          Json::Value::~Value(&local_58);
          Json::Value::Value(&local_80,&local_2c0);
          pmVar3 = std::__detail::
                   _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Json::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Json::Value>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Json::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Json::Value>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                 *)&local_298,value + -2);
          Json::Value::operator=(pmVar3,&local_80);
          Json::Value::~Value(&local_80);
        }
        else {
          pmVar3 = std::__detail::
                   _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Json::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Json::Value>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Json::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Json::Value>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                 *)&local_298,value + -1);
          pVVar2 = Json::Value::operator[](pmVar3,"extraGenerators");
          Json::Value::Value(&local_2c0,value);
          Json::Value::append(pVVar2,&local_2c0);
        }
        Json::Value::~Value(&local_2c0);
      }
      psVar1 = value + 1;
      value = (string *)&value[3]._M_string_length;
    } while ((pointer)&psVar1->_M_string_length !=
             local_308.
             super__Vector_base<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>._M_impl
             .super__Vector_impl_data._M_finish);
  }
  Json::Value::Value(&local_2c0,arrayValue);
  if (local_298._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
    _Var4._M_nxt = local_298._M_before_begin._M_nxt;
    do {
      Json::Value::append(&local_2c0,(Value *)(_Var4._M_nxt + 5));
      _Var4._M_nxt = (_Var4._M_nxt)->_M_nxt;
    } while (_Var4._M_nxt != (_Hash_node_base *)0x0);
  }
  Json::Value::Value(&local_238,&local_2c0);
  pVVar2 = Json::Value::operator[](__return_storage_ptr__,"generators");
  Json::Value::operator=(pVVar2,&local_238);
  Json::Value::~Value(&local_238);
  Json::Value::Value(&local_260,haveServerMode);
  pVVar2 = Json::Value::operator[](__return_storage_ptr__,"serverMode");
  Json::Value::operator=(pVVar2,&local_260);
  Json::Value::~Value(&local_260);
  Json::Value::~Value(&local_2c0);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Json::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Json::Value>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_298);
  std::vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>::~vector(&local_308);
  Json::Value::~Value(&local_2e8);
  return __return_storage_ptr__;
}

Assistant:

Json::Value cmake::ReportCapabilitiesJson(bool haveServerMode) const
{
  Json::Value obj = Json::objectValue;
  // Version information:
  Json::Value version = Json::objectValue;
  version["string"] = CMake_VERSION;
  version["major"] = CMake_VERSION_MAJOR;
  version["minor"] = CMake_VERSION_MINOR;
  version["suffix"] = CMake_VERSION_SUFFIX;
  version["isDirty"] = (CMake_VERSION_IS_DIRTY == 1);
  version["patch"] = CMake_VERSION_PATCH;

  obj["version"] = version;

  // Generators:
  std::vector<cmake::GeneratorInfo> generatorInfoList;
  this->GetRegisteredGenerators(generatorInfoList);

  JsonValueMapType generatorMap;
  for (std::vector<cmake::GeneratorInfo>::const_iterator i =
         generatorInfoList.begin();
       i != generatorInfoList.end(); ++i) {
    if (i->isAlias) { // skip aliases, they are there for compatibility reasons
                      // only
      continue;
    }

    if (i->extraName.empty()) {
      Json::Value gen = Json::objectValue;
      gen["name"] = i->name;
      gen["toolsetSupport"] = i->supportsToolset;
      gen["platformSupport"] = i->supportsPlatform;
      gen["extraGenerators"] = Json::arrayValue;
      generatorMap[i->name] = gen;
    } else {
      Json::Value& gen = generatorMap[i->baseName];
      gen["extraGenerators"].append(i->extraName);
    }
  }

  Json::Value generators = Json::arrayValue;
  for (JsonValueMapType::const_iterator i = generatorMap.begin();
       i != generatorMap.end(); ++i) {
    generators.append(i->second);
  }
  obj["generators"] = generators;
  obj["serverMode"] = haveServerMode;

  return obj;
}